

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O3

UINT8 DecompressDataBlk_VGM
                (UINT32 *outLen,UINT8 **retOutData,UINT32 inLen,UINT8 *inData,
                PCM_COMPR_TBL *comprTbl)

{
  uint uVar1;
  UINT8 UVar2;
  UINT8 *outData;
  PCM_CDB_INF comprInf;
  PCM_CMP_INF local_40;
  
  UVar2 = '\x10';
  if (4 < inLen) {
    local_40.comprType = *inData;
    uVar1 = *(uint *)(inData + 1);
    UVar2 = 0x80;
    if ((local_40.comprType < 2) && (UVar2 = '\x10', 9 < inLen)) {
      local_40.bitsDec = inData[5];
      local_40.bitsCmp = inData[6];
      local_40.subType = inData[7];
      local_40.baseVal = *(UINT16 *)(inData + 8);
      *outLen = uVar1;
      outData = (UINT8 *)realloc(*retOutData,(ulong)uVar1);
      *retOutData = outData;
      local_40.comprTbl = comprTbl;
      UVar2 = DecompressDataBlk(*outLen,outData,inLen - 10,inData + 10,&local_40);
    }
  }
  return UVar2;
}

Assistant:

UINT8 DecompressDataBlk_VGM(UINT32* outLen, UINT8** retOutData, UINT32 inLen, const UINT8* inData, const PCM_COMPR_TBL* comprTbl)
{
	UINT8 retVal;
	PCM_CDB_INF comprInf;
	
	retVal = ReadComprDataBlkHdr(inLen, inData, &comprInf);
	if (retVal)
		return retVal;
	
	*outLen = comprInf.decmpLen;
	*retOutData = (UINT8*)realloc(*retOutData, *outLen);
	comprInf.cmprInfo.comprTbl = comprTbl;
	
	return DecompressDataBlk(*outLen, *retOutData, inLen - comprInf.hdrSize, &inData[comprInf.hdrSize], &comprInf.cmprInfo);
}